

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factorgraph.cpp
# Opt level: O1

VarSet * __thiscall
libDAI::FactorGraph::Delta(VarSet *__return_storage_ptr__,FactorGraph *this,VarSet *ns)

{
  pointer pVVar1;
  VarSet local_48;
  
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __return_storage_ptr__->_statespace = 1;
  pVVar1 = (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pVVar1 != (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                super__Vector_impl_data._M_finish) {
    do {
      (*(this->super_GraphicalModel)._vptr_GraphicalModel[0xd])(&local_48,this,pVVar1);
      VarSet::operator|=(__return_storage_ptr__,&local_48);
      if (local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_48._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_48._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_48._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      pVVar1 = pVVar1 + 1;
    } while (pVVar1 != (ns->_vars).super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>.
                       _M_impl.super__Vector_impl_data._M_finish);
  }
  return __return_storage_ptr__;
}

Assistant:

VarSet FactorGraph::Delta( const VarSet &ns ) const {
        VarSet result;
        for( VarSet::const_iterator n = ns.begin(); n != ns.end(); n++ ) 
            result |= Delta(*n);
        return result;
    }